

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O1

void __thiscall DIS::IntercomControlPdu::~IntercomControlPdu(IntercomControlPdu *this)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pIVar3;
  
  (this->super_RadioCommunicationsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__IntercomControlPdu_001a0480;
  pIVar1 = (this->_intercomParameters).
           super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->_intercomParameters).
           super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = pIVar1;
  if (pIVar2 != pIVar1) {
    do {
      (**pIVar3->_vptr_IntercomCommunicationsParameters)(pIVar3);
      pIVar3 = pIVar3 + 1;
    } while (pIVar3 != pIVar2);
    (this->_intercomParameters).
    super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
  }
  std::
  vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
  ::~vector(&this->_intercomParameters);
  EntityID::~EntityID(&this->_masterEntityID);
  EntityID::~EntityID(&this->_sourceEntityID);
  RadioCommunicationsFamilyPdu::~RadioCommunicationsFamilyPdu
            (&this->super_RadioCommunicationsFamilyPdu);
  return;
}

Assistant:

IntercomControlPdu::~IntercomControlPdu()
{
    _intercomParameters.clear();
}